

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_point.cpp
# Opt level: O0

void __thiscall ON_3fPoint::Transform(ON_3fPoint *this,ON_Xform *xform)

{
  float fVar1;
  float fVar2;
  float fVar3;
  double dVar4;
  double dVar5;
  double dVar6;
  double dVar7;
  double dVar8;
  double dVar9;
  double dVar10;
  double dVar11;
  double dVar12;
  double zz;
  double yy;
  double xx;
  double ww;
  ON_Xform *xform_local;
  ON_3fPoint *this_local;
  
  dVar12 = xform->m_xform[3][2] * (double)this->z +
           xform->m_xform[3][0] * (double)this->x + xform->m_xform[3][1] * (double)this->y +
           xform->m_xform[3][3];
  if ((dVar12 != 0.0) || (NAN(dVar12))) {
    dVar4 = xform->m_xform[1][0];
    fVar1 = this->x;
    dVar5 = xform->m_xform[1][1];
    dVar6 = xform->m_xform[1][2];
    dVar7 = xform->m_xform[1][3];
    dVar8 = xform->m_xform[2][0];
    fVar2 = this->x;
    dVar9 = xform->m_xform[2][1];
    fVar3 = this->y;
    dVar10 = xform->m_xform[2][2];
    dVar11 = xform->m_xform[2][3];
    this->x = (float)((xform->m_xform[0][2] * (double)this->z +
                       xform->m_xform[0][0] * (double)this->x +
                       xform->m_xform[0][1] * (double)this->y + xform->m_xform[0][3]) / dVar12);
    this->y = (float)((dVar6 * (double)this->z + dVar4 * (double)fVar1 + dVar5 * (double)this->y +
                      dVar7) / dVar12);
    this->z = (float)((dVar10 * (double)this->z + dVar8 * (double)fVar2 + dVar9 * (double)fVar3 +
                      dVar11) / dVar12);
  }
  else {
    ON_ErrorEx("/workspace/llm4binary/github/license_c_cmakelists/mcneel[P]opennurbs/opennurbs_point.cpp"
               ,0x58a,"","divide by zero.");
    fVar1 = NanPoint.y;
    this->x = NanPoint.x;
    this->y = fVar1;
    this->z = NanPoint.z;
  }
  return;
}

Assistant:

void ON_3fPoint::Transform( const ON_Xform& xform )
{
  const double ww = xform.m_xform[3][0]*x + xform.m_xform[3][1]*y + xform.m_xform[3][2]*z + xform.m_xform[3][3];
  if (0.0 == ww)
  {
    ON_ERROR("divide by zero.");
    *this = ON_3fPoint::NanPoint;
  }
  else
  {
    const double xx = (xform.m_xform[0][0] * x + xform.m_xform[0][1] * y + xform.m_xform[0][2] * z + xform.m_xform[0][3]) / ww;
    const double yy = (xform.m_xform[1][0] * x + xform.m_xform[1][1] * y + xform.m_xform[1][2] * z + xform.m_xform[1][3]) / ww;
    const double zz = (xform.m_xform[2][0] * x + xform.m_xform[2][1] * y + xform.m_xform[2][2] * z + xform.m_xform[2][3]) / ww;
    x = (float)xx;
    y = (float)yy;
    z = (float)zz;
  }
}